

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,TransportMode mode)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "Importance";
  if ((int)this == 0) {
    __s = "Radiance";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(TransportMode mode) {
    return mode == TransportMode::Radiance ? "Radiance" : "Importance";
}